

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot_light.h
# Opt level: O0

void __thiscall
CMU462::DynamicScene::SpotLight::SpotLight
          (SpotLight *this,LightInfo *light_info,Matrix4x4 *transform)

{
  Vector4D *in_RDX;
  long in_RSI;
  Vector3D *in_RDI;
  Vector4D *unaff_retaddr;
  Matrix4x4 *in_stack_00000008;
  Vector4D *this_00;
  Vector4D local_e0 [2];
  double local_88;
  double local_80;
  double local_78;
  Vector4D local_70 [2];
  _func_int **local_30;
  double local_28;
  double local_20;
  Vector4D *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  SceneLight::SceneLight((SceneLight *)in_RDI);
  in_RDI->x = (double)&PTR_get_static_light_003bb3e8;
  Spectrum::Spectrum((Spectrum *)&in_RDI->y,0.0,0.0,0.0);
  Vector3D::Vector3D(in_RDI + 1);
  Vector3D::Vector3D(in_RDI + 2);
  in_RDI->y = *(double *)(local_10 + 0x4c);
  *(undefined4 *)&in_RDI->z = *(undefined4 *)(local_10 + 0x54);
  this_00 = local_18;
  Vector4D::Vector4D(local_70,(Vector3D *)(local_10 + 0x58),1.0);
  Matrix4x4::operator*(in_stack_00000008,unaff_retaddr);
  Vector4D::to3D(this_00);
  in_RDI[2].x = (double)local_30;
  in_RDI[2].y = local_28;
  in_RDI[2].z = local_20;
  Vector4D::Vector4D(local_e0,(Vector3D *)(local_10 + 0x70),1.0);
  Matrix4x4::operator*(in_stack_00000008,unaff_retaddr);
  Vector4D::to3D(this_00);
  Vector3D::operator-(in_RDI,(Vector3D *)local_18);
  in_RDI[1].x = local_88;
  in_RDI[1].y = local_80;
  in_RDI[1].z = local_78;
  Vector3D::normalize((Vector3D *)local_18);
  return;
}

Assistant:

SpotLight(const Collada::LightInfo& light_info, const Matrix4x4& transform) {
    this->spectrum = light_info.spectrum;
    this->position = (transform * Vector4D(light_info.position, 1)).to3D();
    this->direction =
        (transform * Vector4D(light_info.direction, 1)).to3D() - position;
    this->direction.normalize();
  }